

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomNodeList __thiscall QDomNode::childNodes(QDomNode *this)

{
  QDomNodePrivate *pQVar1;
  QDomNodeListPrivate *pimpl;
  long *in_RSI;
  
  pQVar1 = (QDomNodePrivate *)*in_RSI;
  if (pQVar1 == (QDomNodePrivate *)0x0) {
    QDomNodeList::QDomNodeList((QDomNodeList *)this);
  }
  else {
    pimpl = (QDomNodeListPrivate *)operator_new(0x60);
    (pimpl->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    (pimpl->tagname).d.d = (Data *)0x0;
    (pimpl->tagname).d.ptr = (char16_t *)0x0;
    (pimpl->tagname).d.size = 0;
    (pimpl->nsURI).d.d = (Data *)0x0;
    (pimpl->nsURI).d.ptr = (char16_t *)0x0;
    (pimpl->nsURI).d.size = 0;
    (pimpl->list).d.d = (Data *)0x0;
    (pimpl->list).d.ptr = (QDomNodePrivate **)0x0;
    (pimpl->list).d.size = 0;
    pimpl->node_impl = pQVar1;
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pimpl->timestamp = 0;
    QDomNodeList::QDomNodeList((QDomNodeList *)this,pimpl);
  }
  return (QDomNodeList)(QDomNodeListPrivate *)this;
}

Assistant:

QDomNodeList QDomNode::childNodes() const
{
    if (!impl)
        return QDomNodeList();
    return QDomNodeList(new QDomNodeListPrivate(impl));
}